

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::CanProvide
          (LegacyScriptPubKeyMan *this,CScript *script,SignatureData *sigdata)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  IsMineResult IVar4;
  reference ppVar5;
  _Self *in_RDI;
  long in_FS_OFFSET;
  pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *key_sig_pair;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *__range3;
  bool has_privkeys;
  IsMineResult ismine;
  iterator __end3;
  iterator __begin3;
  SignatureData *in_stack_000000b0;
  CScript *in_stack_000000b8;
  BaseSignatureCreator *in_stack_000000c0;
  SigningProvider *in_stack_000000c8;
  bool in_stack_0000014b;
  IsMineSigVersion in_stack_0000014c;
  CScript *in_stack_00000150;
  LegacyDataSPKM *in_stack_00000158;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IVar4 = anon_unknown_1::IsMineInner
                    (in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_0000014b);
  if ((IVar4 == SPENDABLE) || (IVar4 == WATCH_ONLY)) {
    local_19 = true;
  }
  else {
    ProduceSignature(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    bVar2 = std::
            map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::empty(in_stack_ffffffffffffff98);
    if (bVar2) {
      local_19 = false;
    }
    else {
      local_19 = false;
      std::
      map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      std::
      map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      while (bVar2 = std::operator==(in_RDI,(_Self *)CONCAT17(in_stack_ffffffffffffffa7,
                                                              in_stack_ffffffffffffffa0)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)in_stack_ffffffffffffff98);
        bVar3 = (*(code *)in_RDI->_M_node[7]._M_parent)(in_RDI,ppVar5);
        local_19 = local_19 != false || (bVar3 & 1) != 0;
        std::
        _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_ffffffffffffff98);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool LegacyScriptPubKeyMan::CanProvide(const CScript& script, SignatureData& sigdata)
{
    IsMineResult ismine = IsMineInner(*this, script, IsMineSigVersion::TOP, /* recurse_scripthash= */ false);
    if (ismine == IsMineResult::SPENDABLE || ismine == IsMineResult::WATCH_ONLY) {
        // If ismine, it means we recognize keys or script ids in the script, or
        // are watching the script itself, and we can at least provide metadata
        // or solving information, even if not able to sign fully.
        return true;
    } else {
        // If, given the stuff in sigdata, we could make a valid signature, then we can provide for this script
        ProduceSignature(*this, DUMMY_SIGNATURE_CREATOR, script, sigdata);
        if (!sigdata.signatures.empty()) {
            // If we could make signatures, make sure we have a private key to actually make a signature
            bool has_privkeys = false;
            for (const auto& key_sig_pair : sigdata.signatures) {
                has_privkeys |= HaveKey(key_sig_pair.first);
            }
            return has_privkeys;
        }
        return false;
    }
}